

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Module.c
# Opt level: O2

int init(EVP_PKEY_CTX *ctx)

{
  MCRegisterInfo *MRI;
  uint8_t *puVar1;
  
  if ((*(uint *)(ctx + 4) & 0xfffffff1) != 0) {
    return 5;
  }
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  X86_init(MRI);
  *(code **)(ctx + 8) = X86_Intel_printInst;
  *(undefined4 *)(ctx + 0xe4) = 1;
  *(MCRegisterInfo **)(ctx + 0x10) = MRI;
  *(code **)(ctx + 0x18) = X86_getInstruction;
  *(code **)(ctx + 0x30) = X86_reg_name;
  *(code **)(ctx + 0x48) = X86_get_insn_id;
  *(code **)(ctx + 0x38) = X86_insn_name;
  *(code **)(ctx + 0x40) = X86_group_name;
  *(undefined8 *)(ctx + 0x50) = 0;
  if (*(int *)(ctx + 4) == 8) {
    puVar1 = regsize_map_64;
  }
  else {
    puVar1 = regsize_map_32;
  }
  *(uint8_t **)(ctx + 0x120) = puVar1;
  return 0;
}

Assistant:

static cs_err init(cs_struct *ud)
{
	MCRegisterInfo *mri;

	// verify if requested mode is valid
	if (ud->mode & ~(CS_MODE_LITTLE_ENDIAN | CS_MODE_32 | CS_MODE_64 | CS_MODE_16))
		return CS_ERR_MODE;

	mri = cs_mem_malloc(sizeof(*mri));

	X86_init(mri);

	// by default, we use Intel syntax
	ud->printer = X86_Intel_printInst;
	ud->syntax = CS_OPT_SYNTAX_INTEL;
	ud->printer_info = mri;
	ud->disasm = X86_getInstruction;
	ud->reg_name = X86_reg_name;
	ud->insn_id = X86_get_insn_id;
	ud->insn_name = X86_insn_name;
	ud->group_name = X86_group_name;
	ud->post_printer = NULL;;

	if (ud->mode == CS_MODE_64)
		ud->regsize_map = regsize_map_64;
	else
		ud->regsize_map = regsize_map_32;

	return CS_ERR_OK;
}